

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9ValidRequireExplicitPolicyTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section9ValidRequireExplicitPolicyTest2
          (Section9ValidRequireExplicitPolicyTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9ValidRequireExplicitPolicyTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy5CACert",
                               "requireExplicitPolicy5subCACert",
                               "requireExplicitPolicy5subsubCACert",
                               "requireExplicitPolicy5subsubsubCACert",
                               "ValidrequireExplicitPolicyTest2EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "requireExplicitPolicy5CACRL",
      "requireExplicitPolicy5subCACRL", "requireExplicitPolicy5subsubCACRL",
      "requireExplicitPolicy5subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.2";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}